

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_torrent.cpp
# Opt level: O2

add_torrent_params * __thiscall
libtorrent::load_torrent_buffer
          (add_torrent_params *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
          load_torrent_limits *cfg)

{
  shared_ptr<libtorrent::torrent_info> ti;
  span<const_char> local_48;
  shared_ptr<libtorrent::torrent_info> local_38;
  libtorrent *local_28;
  char *local_20;
  
  local_20 = buffer.m_ptr;
  local_28 = this;
  ::std::
  make_shared<libtorrent::torrent_info,libtorrent::span<char_const>&,libtorrent::load_torrent_limits_const&,libtorrent::from_span_t&>
            (&local_48,(load_torrent_limits *)&local_28,(from_span_t *)buffer.m_len);
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  local_38.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48.m_ptr;
  local_38.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.m_len;
  local_48.m_ptr = (char *)0x0;
  local_48.m_len = 0;
  anon_unknown_21::update_atp(&local_38,__return_storage_ptr__);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.m_len);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params load_torrent_buffer(span<char const> buffer, load_torrent_limits const& cfg)
	{
		auto ti = std::make_shared<torrent_info>(buffer, cfg, from_span);
		add_torrent_params ret;
		update_atp(std::move(ti), ret);
		return ret;
	}